

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load-balance-sampling.hpp
# Opt level: O0

void diy::detail::move_sample_blocks
               (Master *master,Master *aux_master,
               vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>
               *sample_work_info,WorkInfo *my_work_info,float quantile)

{
  NeverSkip *in_RSI;
  MemoryManagement *in_stack_fffffffffffffec0;
  NeverSkip *in_stack_fffffffffffffec8;
  function<bool_(int,_const_diy::Master_&)> *in_stack_fffffffffffffed0;
  _Any_data *this;
  Skip *in_stack_fffffffffffffef0;
  anon_class_32_4_f9d1e44c *in_stack_fffffffffffffef8;
  Master *in_stack_ffffffffffffff00;
  _Any_data local_e8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  MemoryManagement *in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffaf;
  Master *in_stack_ffffffffffffffb0;
  
  std::function<bool(int,diy::Master_const&)>::function<diy::Master::NeverSkip,void>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  Master::
  foreach<diy::detail::move_sample_blocks(diy::Master&,diy::Master&,std::vector<diy::detail::WorkInfo,std::allocator<diy::detail::WorkInfo>>const&,diy::detail::WorkInfo_const&,float)::_lambda(diy::detail::AuxBlock*,diy::Master::ProxyWithLink_const&)_1_>
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  Catch::clara::std::function<bool_(int,_const_diy::Master_&)>::~function
            ((function<bool_(int,_const_diy::Master_&)> *)0x25da0d);
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_e8._M_unused._M_object = (void *)0x0;
  local_e8._8_8_ = 0;
  this = &local_e8;
  MemoryManagement::MemoryManagement(in_stack_fffffffffffffec0);
  Master::exchange(in_stack_ffffffffffffffb0,(bool)in_stack_ffffffffffffffaf,
                   in_stack_ffffffffffffffa0);
  MemoryManagement::~MemoryManagement(in_stack_fffffffffffffec0);
  std::function<bool(int,diy::Master_const&)>::function<diy::Master::NeverSkip,void>
            ((function<bool_(int,_const_diy::Master_&)> *)this,in_RSI);
  Master::
  foreach<diy::detail::move_sample_blocks(diy::Master&,diy::Master&,std::vector<diy::detail::WorkInfo,std::allocator<diy::detail::WorkInfo>>const&,diy::detail::WorkInfo_const&,float)::_lambda(diy::detail::AuxBlock*,diy::Master::ProxyWithLink_const&)_2_>
            (in_stack_ffffffffffffff00,(anon_class_8_1_60b11ba0 *)in_stack_fffffffffffffef8,
             in_stack_fffffffffffffef0);
  Catch::clara::std::function<bool_(int,_const_diy::Master_&)>::~function
            ((function<bool_(int,_const_diy::Master_&)> *)0x25dac2);
  return;
}

Assistant:

inline void move_sample_blocks(diy::Master&                    master,                 // real master with multiple blocks per process
                        diy::Master&                    aux_master,             // auxiliary master with 1 block per process for communcating between procs
                        const std::vector<WorkInfo>&    sample_work_info,       // sampled work info
                        const WorkInfo&                 my_work_info,           // my work info
                        float                           quantile)               // quantile cutoff above which to move blocks (0.0 - 1.0)
{
    // rexchange moving blocks
    aux_master.foreach([&](AuxBlock* b, const diy::Master::ProxyWithLink& cp)
            { send_block(b, cp, master, sample_work_info, my_work_info, quantile); });
    aux_master.exchange(true);      // true = remote
    aux_master.foreach([&](AuxBlock* b, const diy::Master::ProxyWithLink& cp)
            { recv_block(b, cp, master); });
}